

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O3

BOOL DBG_init_channels(void)

{
  char cVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  FILE *__stream;
  int iVar4;
  uint uVar5;
  BOOL BVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 *puVar10;
  DWORD *pDVar11;
  char **ppcVar12;
  char *__s;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar13 [16];
  long lVar14;
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  char *local_40;
  
  InternalInitializeCriticalSection(&fprintf_crit_section);
  auVar3 = _DAT_00169180;
  auVar13 = pmovsxbq(extraout_XMM0,0x302);
  auVar15 = pmovsxbq(in_XMM1,0x100);
  lVar7 = 3;
  auVar16 = pmovsxbq(in_XMM4,0x404);
  do {
    auVar17 = auVar15 ^ auVar3;
    if (auVar17._0_8_ < -0x7fffffffffffffe9) {
      *(undefined4 *)(lVar7 * 4 + 0x18c124) = 0x10;
    }
    if (auVar17._8_8_ < -0x7fffffffffffffe9) {
      *(undefined4 *)(lVar7 * 4 + 0x18c128) = 0x10;
    }
    auVar17 = auVar13 ^ auVar3;
    if (auVar17._0_8_ < -0x7fffffffffffffe9) {
      *(undefined4 *)(lVar7 * 4 + 0x18c12c) = 0x10;
    }
    if (auVar17._8_8_ < -0x7fffffffffffffe9) {
      dbg_channel_flags[lVar7] = 0x10;
    }
    lVar14 = auVar15._8_8_;
    auVar15._0_8_ = auVar15._0_8_ + auVar16._0_8_;
    auVar15._8_8_ = lVar14 + auVar16._8_8_;
    lVar14 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + auVar16._0_8_;
    auVar13._8_8_ = lVar14 + auVar16._8_8_;
    lVar7 = lVar7 + 4;
  } while (lVar7 != 0x1b);
  pcVar8 = MiscGetenv("PAL_DBG_CHANNELS");
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
LAB_001320a9:
    PAL_free(pcVar8);
    pcVar8 = MiscGetenv("PAL_API_TRACING");
    if (((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) ||
       (iVar4 = strcmp(pcVar8,"stderr"), iVar4 == 0)) {
      puVar10 = (undefined8 *)&stderr;
LAB_00132136:
      output_file = (FILE *)*puVar10;
    }
    else {
      iVar4 = strcmp(pcVar8,"stdout");
      if (iVar4 == 0) {
        puVar10 = (undefined8 *)&stdout;
        goto LAB_00132136;
      }
      output_file = (FILE *)fopen64(pcVar8,"at");
      if ((FILE *)output_file == (FILE *)0x0) {
        output_file = (FILE *)_stderr;
        fprintf(_stderr,
                "Can\'t open %s for writing : debug messages will go to stderr. Check your PAL_API_TRACING variable!\n"
                ,pcVar8);
      }
    }
    pcVar8 = MiscGetenv("PAL_DISABLE_ASSERTS");
    if ((pcVar8 == (char *)0x0) || (iVar4 = strcmp(pcVar8,"1"), iVar4 != 0)) {
      g_Dbg_asserts_enabled = 1;
    }
    else {
      g_Dbg_asserts_enabled = 0;
    }
    pcVar8 = MiscGetenv("PAL_API_LEVELS");
    if (pcVar8 == (char *)0x0) {
      max_entry_level = 1;
LAB_001321a8:
      uVar5 = pthread_key_create(&entry_level_key,(__destr_function *)0x0);
      __stream = _stderr;
      if (uVar5 != 0) {
        pcVar8 = strerror(uVar5);
        fprintf(__stream,"ERROR : pthread_key_create() failed error:%d (%s)\n",(ulong)uVar5,pcVar8);
        goto LAB_001321e3;
      }
    }
    else {
      max_entry_level = atoi(pcVar8);
      if (max_entry_level != 0) goto LAB_001321a8;
    }
    BVar6 = 1;
  }
  else {
    pcVar8 = PAL__strdup(pcVar8);
    local_40 = pcVar8;
    if (pcVar8 != (char *)0x0) {
      do {
        for (; (cVar1 = *local_40, cVar1 != '+' && (cVar1 != '-')); local_40 = local_40 + 1) {
          if (cVar1 == '\0') goto LAB_001320a9;
        }
        __s = local_40 + 1;
        pcVar9 = strchr(__s,0x3a);
        if (pcVar9 == (char *)0x0) {
          local_40 = (char *)0x0;
        }
        else {
          local_40 = pcVar9 + 1;
          *pcVar9 = '\0';
        }
        pcVar9 = strchr(__s,0x2e);
        if (pcVar9 != (char *)0x0) {
          *pcVar9 = '\0';
          iVar4 = strcmp(pcVar9 + 1,"all");
          if (iVar4 == 0) {
            uVar5 = 0;
            if (cVar1 == '+') {
              uVar5 = 0xffff;
            }
LAB_00131ffe:
            uVar2 = uVar5 & 0xffffffde;
            if ((uVar5 & 1) != 0) {
              uVar2 = uVar5 | 0x20;
            }
            iVar4 = strcmp(__s,"all");
            if (iVar4 == 0) {
              if (cVar1 != '+') {
                lVar7 = 0;
                do {
                  dbg_channel_flags[lVar7] = dbg_channel_flags[lVar7] & uVar2;
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 0x17);
              }
              else {
                lVar7 = 0;
                do {
                  dbg_channel_flags[lVar7] = dbg_channel_flags[lVar7] | uVar2;
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 0x17);
              }
            }
            else {
              lVar7 = 0;
              pDVar11 = dbg_channel_flags;
              do {
                iVar4 = strcmp(__s,*(char **)((long)dbg_channel_names + lVar7));
                if (iVar4 == 0) {
                  uVar5 = *pDVar11 | uVar2;
                  if (cVar1 != '+') {
                    uVar5 = *pDVar11 & uVar2;
                  }
                  *pDVar11 = uVar5;
                  break;
                }
                pDVar11 = pDVar11 + 1;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0xb8);
            }
          }
          else {
            ppcVar12 = dbg_level_names;
            lVar7 = 0;
            do {
              iVar4 = strcmp(pcVar9 + 1,*ppcVar12);
              if (iVar4 == 0) {
                uVar5 = -(uint)(cVar1 != '+') ^ 1 << ((uint)lVar7 & 0x1f);
                goto LAB_00131ffe;
              }
              lVar7 = lVar7 + 1;
              ppcVar12 = ppcVar12 + 1;
            } while (lVar7 != 6);
          }
        }
      } while (local_40 != (char *)0x0);
      goto LAB_001320a9;
    }
LAB_001321e3:
    DeleteCriticalSection(&fprintf_crit_section);
    BVar6 = 0;
  }
  return BVar6;
}

Assistant:

BOOL DBG_init_channels(void)
{
    INT i;
    LPCSTR env_string;
    LPSTR env_workstring;
    LPSTR env_pcache;
    LPSTR entry_ptr;
    LPSTR level_ptr;
    CHAR plus_or_minus;
    DWORD flag_mask = 0;
    int ret;

    InternalInitializeCriticalSection(&fprintf_crit_section);

    /* output only asserts by default [only affects no-vararg-support case; if
       we have varargs, these flags aren't even checked for ASSERTs] */
    for(i=0;i<DCI_LAST;i++)
        dbg_channel_flags[i]=1<<DLI_ASSERT;

    /* parse PAL_DBG_CHANNELS environment variable */

    if (!(env_string = MiscGetenv(ENV_CHANNELS)))
    {
        env_pcache = env_workstring = NULL;
    }
    else
    {
        env_pcache = env_workstring = PAL__strdup(env_string);

        if (env_workstring == NULL)
        {
            /* Not enough memory */
            DeleteCriticalSection(&fprintf_crit_section);
            return FALSE;
        }
    }
    while(env_workstring)
    {
        entry_ptr=env_workstring;

        /* find beginning of next entry */
        while((*entry_ptr != '\0') &&(*entry_ptr != '+') && (*entry_ptr != '-'))
        {
            entry_ptr++;
        }

        /* break if end of string is reached */
        if(*entry_ptr == '\0')
        {
           break;
        }

        plus_or_minus=*entry_ptr++;

        /* find end of entry; if strchr returns NULL, we have reached the end
           of the string and we will leave the loop at the end of this pass. */
        env_workstring=strchr(entry_ptr,':');

        /* NULL-terminate entry, make env_string point to rest of string */
        if(env_workstring)
        {
            *env_workstring++='\0';
        }

        /* find period that separates channel name from level name */
        level_ptr=strchr(entry_ptr,'.');

        /* an entry with no period is illegal : ignore it */
        if(!level_ptr)
        {
            continue;
        }
        /* NULL-terminate channel name, make level_ptr point to the level name */
        *level_ptr++='\0';

        /* build the flag mask based on requested level */

        /* if "all" level is specified, we want to open/close all levels at
           once, so mask is either all ones or all zeroes */
        if(!strcmp(level_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                flag_mask=0xFFFF;  /* OR this to open all levels */
            }
            else
            {
                flag_mask=0;       /* AND this to close all levels*/
            }
        }
        else
        {
            for(i=0;i<DLI_LAST;i++)
            {
                if(!strcmp(level_ptr,dbg_level_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        flag_mask=1<<i;     /* OR this to open the level */
                    }
                    else
                    {
                        flag_mask=~(1<<i);  /* AND this to close the level */
                    }
                    break;
                }
            }
            /* didn't find a matching level : skip it. */
            if(i==DLI_LAST)
            {
                continue;
            }
        }

        /* Set EXIT and ENTRY channels to be identical */
        if(!(flag_mask & (1<<DLI_ENTRY)))
        {
            flag_mask = flag_mask & (~(1<<DLI_EXIT));
        }
        else
        {
            flag_mask = flag_mask | (1<<DLI_EXIT);
        }

        /* apply the flag mask to the specified channel */

        /* if "all" channel is specified, apply mask to all channels */
        if(!strcmp(entry_ptr,"all"))
        {
            if(plus_or_minus=='+')
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] |= flag_mask; /* OR to open levels*/
                }
            }
            else
            {
                for(i=0;i<DCI_LAST;i++)
                {
                    dbg_channel_flags[i] &= flag_mask; /* AND to close levels */
                }
            }
        }
        else
        {
            for(i=0;i<DCI_LAST;i++)
            {
                if(!strcmp(entry_ptr,dbg_channel_names[i]))
                {
                    if(plus_or_minus=='+')
                    {
                        dbg_channel_flags[i] |= flag_mask;
                    }
                    else
                    {
                        dbg_channel_flags[i] &= flag_mask;
                    }

                    break;
                }
            }
            /* ignore the entry if the channel name is unknown */
        }
        /* done processing this entry; on to the next. */
    }
    PAL_free(env_pcache);

    /* select output file */
    env_string=MiscGetenv(ENV_FILE);
    if(env_string && *env_string!='\0')
    {
        if(!strcmp(env_string, "stderr"))
        {
            output_file = stderr;
        }
        else if(!strcmp(env_string, "stdout"))
        {
            output_file = stdout;
        }
        else
        {
            output_file = fopen(env_string,FOPEN_FLAGS);

            /* if file can't be opened, default to stderr */
            if(!output_file)
            {
                output_file = stderr;
                fprintf(stderr, "Can't open %s for writing : debug messages "
                        "will go to stderr. Check your PAL_API_TRACING "
                        "variable!\n", env_string);
            }
        }
    }
    else
    {
        output_file = stderr; /* output to stderr by default */
    }

    /* see if we need to disable assertions */
    env_string = MiscGetenv(ENV_ASSERTS);
    if(env_string && 0 == strcmp(env_string,"1"))
    {
        g_Dbg_asserts_enabled = FALSE;
    }
    else
    {
        g_Dbg_asserts_enabled = TRUE;
    }

    /* select ENTRY level limitation */
    env_string = MiscGetenv(ENV_ENTRY_LEVELS);
    if(env_string)
    {
        max_entry_level = atoi(env_string);
    }
    else
    {
        max_entry_level = 1;
    }

    /* if necessary, allocate TLS key for entry nesting level */
    if(0 != max_entry_level)
    {
        if ((ret = pthread_key_create(&entry_level_key,NULL)) != 0)
        {
            fprintf(stderr, "ERROR : pthread_key_create() failed error:%d (%s)\n",
                   ret, strerror(ret));
            DeleteCriticalSection(&fprintf_crit_section);;
            return FALSE;
        }
    }

    return TRUE;
}